

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cc
# Opt level: O3

uintb __thiscall FloatFormat::setFractionalCode(FloatFormat *this,uintb x,uintb code)

{
  return (code >> (-(char)this->frac_size & 0x3fU)) << ((byte)this->frac_pos & 0x3f) | x;
}

Assistant:

uintb FloatFormat::setFractionalCode(uintb x,uintb code) const

{
  // Align with bottom of word, also drops bits of precision
  // we don't have room for
  code >>= 8*sizeof(uintb) - frac_size;
  code <<= frac_pos;		// Move bits into position;
  x |= code;
  return x;
}